

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O2

void __thiscall json::JsonObject::JsonObject(JsonObject *this)

{
  JsonNode::JsonNode(&this->super_JsonNode);
  (this->super_JsonNode)._vptr_JsonNode = (_func_int **)&PTR__JsonObject_001109f8;
  this->childCounter = 0;
  (this->children)._M_h._M_buckets = &(this->children)._M_h._M_single_bucket;
  (this->children)._M_h._M_bucket_count = 1;
  (this->children)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->children)._M_h._M_element_count = 0;
  (this->children)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->children)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->children)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

JsonObject::JsonObject() : JsonNode(), childCounter(0)
    {
    }